

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_cf_ssl_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  uint uVar1;
  CURLcode CVar2;
  Curl_cfilter *in_RAX;
  Curl_cfilter *cf;
  Curl_cfilter *local_18;
  
  uVar1._0_1_ = (data->state).httpwant;
  uVar1._1_1_ = (data->state).httpversion;
  uVar1._2_1_ = (data->state).httpreq;
  uVar1._3_1_ = (data->state).select_bits;
  local_18 = in_RAX;
  CVar2 = cf_ssl_create(&local_18,(Curl_easy *)(ulong)uVar1,
                        (connectdata *)(ulong)(uint)cf_at->conn->bits);
  if (CVar2 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,local_18);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_cf_ssl_insert_after(struct Curl_cfilter *cf_at,
                                  struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_create(&cf, data, cf_at->conn);
  if(!result)
    Curl_conn_cf_insert_after(cf_at, cf);
  return result;
}